

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncoderVelocity.cpp
# Opt level: O2

double __thiscall
EncoderVelocity::GetEncoderAcceleration(EncoderVelocity *this,double percent_threshold)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  double dVar5;
  
  dVar5 = 0.0;
  if (this->velOverflow == false) {
    uVar1 = this->velPeriod;
    uVar2 = this->qtr1Period;
    uVar3 = this->qtr5Period;
    if (this->qtr5Overflow == false) {
      uVar4 = (uVar1 - uVar2) + uVar3;
    }
    else {
      uVar4 = this->velPeriodMax;
    }
    if (((((uVar3 != 0 && uVar2 != 0) && (uVar1 != 0)) && (uVar4 != 0)) &&
        ((this->qtr1Edges == this->qtr5Edges && (this->qtr1Dir == this->qtr5Dir)))) &&
       ((this->qtr1Dir == this->velDir &&
        ((1.0 / (double)uVar2 <= percent_threshold &&
         (dVar5 = (((double)uVar3 - (double)uVar2) * 8.0) /
                  ((double)uVar4 * (double)uVar1 * this->clkPeriod * this->clkPeriod *
                  (double)(uVar2 + uVar3)), this->velDir == false)))))) {
      return -dVar5;
    }
  }
  return dVar5;
}

Assistant:

double EncoderVelocity::GetEncoderAcceleration(double percent_threshold) const
{
    if (velOverflow)
        return 0.0;

    uint32_t velPeriodPrev = velPeriod - qtr1Period + qtr5Period;     // Previous full-cycle period
    if (qtr5Overflow)
        velPeriodPrev = velPeriodMax;

    // Should never happen
    if ((qtr1Period == 0) || (qtr5Period == 0) || (velPeriod == 0) || (velPeriodPrev == 0))
        return 0.0;

    if (qtr1Edges != qtr5Edges)
        return 0.0;

    if ((qtr1Dir != qtr5Dir) || (qtr1Dir != velDir))
        return 0.0;

    double acc = 0.0;
    if (1.0/qtr1Period <= percent_threshold) {
        double qtrDiff = static_cast<double>(qtr5Period) - static_cast<double>(qtr1Period);
        double qtrSum = static_cast<double>(qtr5Period + qtr1Period);
        double velProd = static_cast<double>(velPeriod)*static_cast<double>(velPeriodPrev)*clkPeriod*clkPeriod;
        acc = (8.0*qtrDiff)/(velProd*qtrSum);
        if (!velDir)
            acc = -acc;
    }
    return acc;
}